

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O0

void dropt_init_help_params(dropt_help_params *helpParams)

{
  dropt_help_params *helpParams_local;
  
  if (helpParams == (dropt_help_params *)0x0) {
    dropt_misuse("No dropt help parameters specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                 ,0x5e5);
  }
  else {
    helpParams->indent = 2;
    helpParams->description_start_column = 6;
    helpParams->blank_lines_between_options = '\x01';
  }
  return;
}

Assistant:

void
dropt_init_help_params(dropt_help_params* helpParams)
{
    if (helpParams == NULL)
    {
        DROPT_MISUSE("No dropt help parameters specified.");
        return;
    }

    helpParams->indent = default_help_indent;
    helpParams->description_start_column = default_description_start_column;
    helpParams->blank_lines_between_options = true;
}